

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O2

void __thiscall
gmlc::containers::StableBlockVector<std::__cxx11::string,5u,std::allocator<std::__cxx11::string>>::
emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
          (StableBlockVector<std::__cxx11::string,5u,std::allocator<std::__cxx11::string>> *this,
          basic_string_view<char,_std::char_traits<char>_> *args)

{
  int iVar1;
  long lVar2;
  allocator<char> local_11;
  
  StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::blockCheck((StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this);
  iVar1 = *(int *)(this + 0x18);
  lVar2 = *(long *)(*(long *)(this + 8) + (long)*(int *)(this + 0x14) * 8);
  *(int *)(this + 0x18) = iVar1 + 1;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)((long)iVar1 * 0x20 + lVar2),
             (basic_string_view<char,_std::char_traits<char>_> *)args,&local_11);
  *(long *)this = *(long *)this + 1;
  return;
}

Assistant:

void emplace_back(Args&&... args)
        {
            blockCheck();
            new (&(dataptr[dataSlotIndex][bsize++]))
                X(std::forward<Args>(args)...);
            ++csize;
        }